

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementAssembly::IfcElementAssembly(IfcElementAssembly *this)

{
  IfcElementAssembly *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x190,"IfcElementAssembly");
  IfcElement::IfcElement(&this->super_IfcElement,&PTR_construction_vtable_24__0107a238);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcElementAssembly,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcElementAssembly,_2UL> *)
             &(this->super_IfcElement).field_0x138,&PTR_construction_vtable_24__0107a328);
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x107a130;
  *(undefined8 *)&this->field_0x190 = 0x107a220;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 = 0x107a158;
  (this->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x107a180;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0x107a1a8;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.field_0x100 = 0x107a1d0;
  *(undefined8 *)&(this->super_IfcElement).field_0x138 = 0x107a1f8;
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_IfcElement).field_0x148);
  std::__cxx11::string::string((string *)&this->PredefinedType);
  return;
}

Assistant:

IfcElementAssembly() : Object("IfcElementAssembly") {}